

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *this;
  int local_1c;
  int result;
  int n;
  Fib *fib;
  
  fib._4_4_ = 0;
  _result = (Fib *)operator_new(1);
  local_1c = 0;
  std::istream::operator>>((istream *)&std::cin,&local_1c);
  iVar1 = Fib::calculate(_result,local_1c);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  if (_result != (Fib *)0x0) {
    operator_delete(_result);
  }
  return fib._4_4_;
}

Assistant:

int main()
{
  Fib * fib = new Fib();
  int n = 0;
  std::cin >> n;
  int result = fib->calculate(n);
  std::cout << result << std::endl;
  delete(fib);
}